

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O1

void __thiscall neueda::cdr::deleteItem(cdr *this,cdrKey_t *key)

{
  itemMap *this_00;
  size_type sVar1;
  mapped_type *pmVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
  pVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_neueda::cdrItem>_>,_std::_Rb_tree_iterator<std::pair<const_int,_neueda::cdrItem>_>_>
  pVar4;
  
  this_00 = &this->mItems;
  sVar1 = std::
          map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
          ::count(this_00,key);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
             ::operator[](this_00,key);
    pVar3 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_neueda::cdrItem_*>,_std::_Select1st<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
            ::equal_range(&(this->mOrdered)._M_t,&pmVar2->mIndex);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_neueda::cdrItem_*>,_std::_Select1st<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
    ::_M_erase_aux(&(this->mOrdered)._M_t,(_Base_ptr)pVar3.first._M_node,
                   (_Base_ptr)pVar3.second._M_node);
    pVar4 = std::
            _Rb_tree<int,_std::pair<const_int,_neueda::cdrItem>,_std::_Select1st<std::pair<const_int,_neueda::cdrItem>_>,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
            ::equal_range(&this_00->_M_t,key);
    std::
    _Rb_tree<int,_std::pair<const_int,_neueda::cdrItem>,_std::_Select1st<std::pair<const_int,_neueda::cdrItem>_>,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
    return;
  }
  return;
}

Assistant:

void
cdr::deleteItem (const cdrKey_t& key)
{
    if (mItems.count (key) != 0)
    {
        mOrdered.erase (mItems[key].mIndex);
        mItems.erase (key);
    }
}